

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int rsa2_pubkey_bits(ssh_keyalg *self,ptrlen pub)

{
  int iVar1;
  ssh_key *psVar2;
  size_t sVar3;
  
  psVar2 = rsa2_new_pub(self,pub);
  if (psVar2 == (ssh_key *)0x0) {
    iVar1 = -1;
  }
  else {
    sVar3 = mp_get_nbits((mp_int *)psVar2[-7].vt);
    iVar1 = (int)sVar3;
    freersakey((RSAKey *)(psVar2 + -8));
    safefree((RSAKey *)(psVar2 + -8));
  }
  return iVar1;
}

Assistant:

static int rsa2_pubkey_bits(const ssh_keyalg *self, ptrlen pub)
{
    ssh_key *sshk;
    RSAKey *rsa;
    int ret;

    sshk = rsa2_new_pub(self, pub);
    if (!sshk)
        return -1;

    rsa = container_of(sshk, RSAKey, sshk);
    ret = mp_get_nbits(rsa->modulus);
    rsa2_freekey(&rsa->sshk);

    return ret;
}